

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteVmInstallCollection(unqlite_vm *pVm,unqlite_col *pCol)

{
  uint uVar1;
  unqlite_col *puVar2;
  unqlite_col *puVar3;
  sxu32 sVar4;
  unqlite_col **ppuVar5;
  unqlite_col **ppuVar6;
  uint uVar7;
  unqlite_col **ppuVar8;
  bool bVar9;
  
  sVar4 = SyBinHash((pCol->sName).zString,(pCol->sName).nByte);
  pCol->nHash = sVar4;
  uVar1 = pVm->iColSize;
  uVar7 = uVar1 - 1 & sVar4;
  ppuVar8 = pVm->apCol;
  puVar2 = ppuVar8[uVar7];
  pCol->pNextCol = puVar2;
  if (puVar2 != (unqlite_col *)0x0) {
    puVar2->pPrevCol = pCol;
  }
  ppuVar8[uVar7] = pCol;
  puVar2 = pVm->pCol;
  if (puVar2 != (unqlite_col *)0x0) {
    pCol->pNext = puVar2;
    puVar2->pPrev = pCol;
  }
  pVm->pCol = pCol;
  uVar7 = pVm->iCol + 1;
  pVm->iCol = uVar7;
  bVar9 = uVar7 < uVar1 * 4;
  ppuVar8 = (unqlite_col **)(ulong)CONCAT31((int3)(uVar7 >> 8),9999 < uVar7 || bVar9);
  if (9999 >= uVar7 && !bVar9) {
    ppuVar5 = (unqlite_col **)SyMemBackendAlloc(&pVm->sAlloc,uVar1 << 4);
    ppuVar8 = ppuVar5;
    if (ppuVar5 != (unqlite_col **)0x0) {
      if ((uVar1 & 0xfffffff) != 0) {
        ppuVar6 = (unqlite_col **)((long)ppuVar5 + (ulong)(uVar1 << 4));
        do {
          *(undefined1 *)ppuVar8 = 0;
          if (ppuVar6 <= (unqlite_col **)((long)ppuVar8 + 1)) break;
          *(undefined1 *)((long)ppuVar8 + 1) = 0;
          if (ppuVar6 <= (unqlite_col **)((long)ppuVar8 + 2)) break;
          *(undefined1 *)((long)ppuVar8 + 2) = 0;
          if (ppuVar6 <= (unqlite_col **)((long)ppuVar8 + 3)) break;
          *(undefined1 *)((long)ppuVar8 + 3) = 0;
          ppuVar8 = (unqlite_col **)((long)ppuVar8 + 4);
        } while (ppuVar8 < ppuVar6);
      }
      sVar4 = pVm->iCol;
      if (sVar4 != 0) {
        ppuVar8 = &pVm->pCol;
        do {
          puVar2 = *ppuVar8;
          puVar2->pNextCol = (unqlite_col *)0x0;
          puVar2->pPrevCol = (unqlite_col *)0x0;
          uVar7 = puVar2->nHash & uVar1 * 2 - 1;
          puVar3 = ppuVar5[uVar7];
          puVar2->pNextCol = puVar3;
          if (puVar3 != (unqlite_col *)0x0) {
            puVar3->pPrevCol = puVar2;
          }
          ppuVar5[uVar7] = puVar2;
          ppuVar8 = &puVar2->pNext;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      uVar7 = SyMemBackendFree(&pVm->sAlloc,pVm->apCol);
      ppuVar8 = (unqlite_col **)(ulong)uVar7;
      pVm->apCol = ppuVar5;
      pVm->iColSize = uVar1 * 2;
    }
  }
  return (int)ppuVar8;
}

Assistant:

static int unqliteVmInstallCollection(
	unqlite_vm *pVm,  /* Target VM */
	unqlite_col *pCol /* Collection to install */
	)
{
	SyString *pName = &pCol->sName;
	sxu32 iBucket;
	/* Hash the collection name */
	pCol->nHash = SyBinHash((const void *)pName->zString,pName->nByte);
	/* Install it in the corresponding bucket */
	iBucket = pCol->nHash & (pVm->iColSize - 1);
	pCol->pNextCol = pVm->apCol[iBucket];
	if( pVm->apCol[iBucket] ){
		pVm->apCol[iBucket]->pPrevCol = pCol;
	}
	pVm->apCol[iBucket] = pCol;
	/* Link to the list of active collections */
	MACRO_LD_PUSH(pVm->pCol,pCol);
	pVm->iCol++;
	if( (pVm->iCol >= pVm->iColSize * 4) && pVm->iCol < 10000 ){
		/* Grow the hashtable */
		sxu32 nNewSize = pVm->iColSize << 1;
		unqlite_col *pEntry;
		unqlite_col **apNew;
		sxu32 n;
		
		apNew = (unqlite_col **)SyMemBackendAlloc(&pVm->sAlloc, nNewSize * sizeof(unqlite_col *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(unqlite_col *));
			/* Rehash all entries */
			n = 0;
			pEntry = pVm->pCol;
			for(;;){
				/* Loop one */
				if( n >= pVm->iCol ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->nHash & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pVm->sAlloc,(void *)pVm->apCol);
			pVm->apCol = apNew;
			pVm->iColSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}